

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall
QDialogButtonBoxPrivate::addButton
          (QDialogButtonBoxPrivate *this,QAbstractButton *button,ButtonRole role,
          LayoutRule layoutRule,AddRule addRule)

{
  int in_ECX;
  undefined4 in_EDX;
  QObject *in_RSI;
  int in_R8D;
  long in_FS_OFFSET;
  parameter_type in_stack_ffffffffffffff48;
  ConnectionType type;
  uint in_stack_ffffffffffffffa8;
  Function in_stack_ffffffffffffffd0;
  Connection local_28;
  code *signal;
  Connection local_10;
  QDialogButtonBoxPrivate *this_00;
  
  this_00 = *(QDialogButtonBoxPrivate **)(in_FS_OFFSET + 0x28);
  QList<QAbstractButton_*>::append((QList<QAbstractButton_*> *)0x66ca68,in_stack_ffffffffffffff48);
  if (in_R8D == 0) {
    type = AutoConnection;
    signal = handleButtonClicked;
    QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QDialogButtonBoxPrivate::*)()>
              ((Object *)CONCAT44(in_EDX,in_ECX),0x66cbf0,(Object *)(ulong)in_stack_ffffffffffffffa8
               ,in_stack_ffffffffffffffd0,AutoConnection);
    QMetaObject::Connection::~Connection(&local_10);
    QObjectPrivate::connect<void(QObject::*)(QObject*),void(QDialogButtonBoxPrivate::*)()>
              ((Object *)CONCAT44(in_EDX,in_ECX),(offset_in_QObject_to_subr)signal,
               (Object *)CONCAT44(in_R8D,in_stack_ffffffffffffffa8),0,type);
    QMetaObject::Connection::~Connection(&local_28);
    std::unique_ptr<QObject,_std::default_delete<QObject>_>::get
              ((unique_ptr<QObject,_std::default_delete<QObject>_> *)0x66cb8d);
    QObject::installEventFilter(in_RSI);
  }
  if (in_ECX == 0) {
    layoutButtons(this_00);
  }
  if (*(QDialogButtonBoxPrivate **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::addButton(QAbstractButton *button, QDialogButtonBox::ButtonRole role,
                                        LayoutRule layoutRule, AddRule addRule)
{
    buttonLists[role].append(button);
    switch (addRule) {
    case AddRule::Connect:
        QObjectPrivate::connect(button, &QAbstractButton::clicked,
                               this, &QDialogButtonBoxPrivate::handleButtonClicked);
        QObjectPrivate::connect(button, &QAbstractButton::destroyed,
                               this, &QDialogButtonBoxPrivate::handleButtonDestroyed);
        button->installEventFilter(filter.get());
        break;
    case AddRule::SkipConnect:
        break;
    }

    switch (layoutRule) {
    case LayoutRule::DoLayout:
        layoutButtons();
        break;
    case LayoutRule::SkipLayout:
        break;
    }
}